

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_make_space(event_signal_map *map,int slot,int msize)

{
  void **ppvVar1;
  int local_34;
  void **tmp;
  int nentries;
  int msize_local;
  int slot_local;
  event_signal_map *map_local;
  
  if (map->nentries <= slot) {
    if (map->nentries == 0) {
      local_34 = 0x20;
    }
    else {
      local_34 = map->nentries;
    }
    tmp._4_4_ = local_34;
    if (0x3fffffff < slot) {
      return -1;
    }
    for (; tmp._4_4_ <= slot; tmp._4_4_ = tmp._4_4_ << 1) {
    }
    if ((int)(0x7fffffff / (long)msize) < tmp._4_4_) {
      return -1;
    }
    ppvVar1 = (void **)event_mm_realloc_(map->entries,(long)(tmp._4_4_ * msize));
    if (ppvVar1 == (void **)0x0) {
      return -1;
    }
    memset(ppvVar1 + map->nentries,0,(long)((tmp._4_4_ - map->nentries) * msize));
    map->nentries = tmp._4_4_;
    map->entries = ppvVar1;
  }
  return 0;
}

Assistant:

static int
evmap_make_space(struct event_signal_map *map, int slot, int msize)
{
	if (map->nentries <= slot) {
		int nentries = map->nentries ? map->nentries : 32;
		void **tmp;

		if (slot > INT_MAX / 2)
			return (-1);

		while (nentries <= slot)
			nentries <<= 1;

		if (nentries > INT_MAX / msize)
			return (-1);

		tmp = (void **)mm_realloc(map->entries, nentries * msize);
		if (tmp == NULL)
			return (-1);

		memset(&tmp[map->nentries], 0,
		    (nentries - map->nentries) * msize);

		map->nentries = nentries;
		map->entries = tmp;
	}

	return (0);
}